

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_hamt_map.cpp
# Opt level: O3

void __thiscall
DefaultIndexFixture_UpsertInternalStore_Test::~DefaultIndexFixture_UpsertInternalStore_Test
          (DefaultIndexFixture_UpsertInternalStore_Test *this)

{
  (this->super_DefaultIndexFixture).super_IndexFixture.super_Test._vptr_Test =
       (_func_int **)&PTR__DefaultIndexFixture_0026d6f0;
  std::
  unique_ptr<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::default_delete<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~unique_ptr(&(this->super_DefaultIndexFixture).index_);
  (this->super_DefaultIndexFixture).super_IndexFixture.super_Test._vptr_Test =
       (_func_int **)&PTR__IndexFixture_0026d6b0;
  pstore::database::~database(&(this->super_DefaultIndexFixture).super_IndexFixture.db_);
  in_memory_store::~in_memory_store(&(this->super_DefaultIndexFixture).super_IndexFixture.store_);
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x160);
  return;
}

Assistant:

TEST_F (DefaultIndexFixture, UpsertInternalStore) {
    transaction_type t1 = begin (db_, lock_guard{mutex_});
    std::pair<default_index::iterator, bool> itp1 =
        index_->insert_or_assign (t1, std::make_pair ("a"s, "b"s));
    std::pair<default_index::iterator, bool> itp2 =
        index_->insert_or_assign (t1, std::make_pair ("c"s, "d"s));

    std::string const & key1 = (*itp1.first).first;
    EXPECT_EQ ("a", key1);
    EXPECT_TRUE (itp1.second);
    std::string const & key2 = (*itp2.first).first;
    EXPECT_EQ ("c", key2);
    EXPECT_TRUE (itp2.second);

    index_->flush (t1, db_.get_current_revision ());

    std::pair<default_index::iterator, bool> itp3 =
        index_->insert_or_assign (t1, std::make_pair ("c"s, "f"s));
    std::string & value = (*itp3.first).second;
    EXPECT_EQ ("f", value);
    EXPECT_FALSE (itp3.second);
}